

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantTriangleSetTestInstance::compare
          (InvariantTriangleSetTestInstance *this,PerPrimitiveVec *primitivesA,
          PerPrimitiveVec *primitivesB,int param_3)

{
  _Rb_tree_header *p_Var1;
  ostringstream *poVar2;
  PerPrimitiveVec *pPVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  Vector<tcu::Vector<float,_3>,_3> *b;
  bool bVar6;
  long lVar7;
  int aOrB;
  int iVar8;
  _Rb_tree_header *p_Var9;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *this_00;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  TriangleSet trianglesB;
  TriangleSet trianglesA;
  Triangle triangle;
  allocator<char> local_251;
  TestLog *local_250;
  ulong local_248;
  ulong local_240;
  PerPrimitiveVec *local_238;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_230;
  string local_200 [32];
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_1e0;
  MessageBuilder local_1b0;
  
  local_250 = ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  local_240 = (long)(primitivesA->
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(primitivesA->
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                    )._M_impl.super__Vector_impl_data._M_start;
  local_248 = (long)(primitivesB->
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(primitivesB->
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                    )._M_impl.super__Vector_impl_data._M_start;
  local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e0._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1e0._M_t._M_impl._0_1_ = 0;
  local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_230._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_230._M_t._M_impl.super__Rb_tree_header._M_header;
  local_230._M_t._M_impl._0_1_ = 0;
  local_230._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_230._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_230._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_238 = primitivesA;
  local_230._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_230._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
    uVar10 = local_248;
    if (iVar8 == 0) {
      uVar10 = local_240;
    }
    this_00 = &local_230;
    if (iVar8 == 0) {
      this_00 = &local_1e0;
    }
    uVar11 = uVar10 >> 6 & 0xffffffff;
    if ((int)(uVar10 >> 6) < 1) {
      uVar11 = 0;
    }
    for (lVar7 = 0; uVar11 * 0x40 != lVar7; lVar7 = lVar7 + 0x40) {
      pPVar3 = primitivesB;
      if (iVar8 == 0) {
        pPVar3 = local_238;
      }
      makeTriangle((Triangle *)&local_1b0,
                   (PerPrimitive *)
                   ((long)((pPVar3->
                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                           )._M_impl.super__Vector_impl_data._M_start)->unused_padding + lVar7 + -8)
                  );
      std::sort<tcu::Vector<float,3>*,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>
                (&local_1b0,&local_1b0.field_0x24);
      std::
      set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
      ::insert(this_00,(value_type *)&local_1b0);
    }
  }
  p_Var1 = &local_1e0._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = local_230._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    p_Var9 = &local_230._M_t._M_impl.super__Rb_tree_header;
    bVar12 = (_Rb_tree_header *)p_Var4 == p_Var1;
    bVar13 = (_Rb_tree_header *)p_Var5 == p_Var9;
    bVar6 = bVar12 && bVar13;
    if (bVar6) {
LAB_00729c38:
      std::
      set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
      ::~set(&local_230);
      std::
      set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
      ::~set(&local_1e0);
      return bVar6;
    }
    if (((_Rb_tree_header *)p_Var5 == p_Var9) || ((_Rb_tree_header *)p_Var4 == p_Var1)) {
LAB_00729adc:
      poVar2 = &local_1b0.m_str;
      local_1b0.m_log = local_250;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      std::operator<<((ostream *)poVar2,
                      "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                     );
      std::__cxx11::string::string<std::allocator<char>>(local_200,"",&local_251);
      std::operator<<((ostream *)poVar2,local_200);
      std::operator<<((ostream *)poVar2,")");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
      if (bVar12) {
LAB_00729b61:
        poVar2 = &local_1b0.m_str;
        local_1b0.m_log = local_250;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        std::operator<<((ostream *)poVar2,"Note: e.g. triangle ");
        tcu::operator<<((ostream *)poVar2,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var5 + 1));
        std::operator<<((ostream *)poVar2," exists for second case but not for first");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        if (!bVar13) {
          bVar12 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                   ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                                 *)(p_Var4 + 1),(Vector<tcu::Vector<float,_3>,_3> *)(p_Var5 + 1),b);
          if (!bVar12) goto LAB_00729b61;
        }
        poVar2 = &local_1b0.m_str;
        local_1b0.m_log = local_250;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        std::operator<<((ostream *)poVar2,"Note: e.g. triangle ");
        tcu::operator<<((ostream *)poVar2,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var4 + 1));
        std::operator<<((ostream *)poVar2," exists for first case but not for second");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
      goto LAB_00729c38;
    }
    bVar12 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator!=
                       ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var4 + 1),
                        (Vector<tcu::Vector<float,_3>,_3> *)(p_Var5 + 1));
    if (bVar12) {
      bVar12 = false;
      bVar13 = false;
      goto LAB_00729adc;
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

bool compare (const PerPrimitiveVec& primitivesA, const PerPrimitiveVec& primitivesB, const int) const
	{
		return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog());
	}